

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_checker.cc
# Opt level: O3

void __thiscall dd::SequenceCheckerImpl::SequenceCheckerImpl(SequenceCheckerImpl *this)

{
  PlatformThreadRef PVar1;
  TaskQueueBase *pTVar2;
  
  pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  this->_attached = true;
  PVar1 = CurrentThreadRef();
  this->_valid_thread = PVar1;
  pTVar2 = TaskQueueBase::Current();
  this->_valid_queue = pTVar2;
  this->_valid_system_queue = (void *)0x0;
  return;
}

Assistant:

SequenceCheckerImpl::SequenceCheckerImpl()
		:_attached(true),
		_valid_thread(CurrentThreadRef()),
		_valid_queue(TaskQueueBase::Current()),
		_valid_system_queue(GetSystemQueueRef())
	{

	}